

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::close_submessage
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this)

{
  assert_error *this_00;
  size_t sVar1;
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this_local;
  
  if (this->m_data != (fixed_size_buffer_adaptor *)0x0) {
    if ((this->m_pos != 0) && (this->m_rollback_pos != 0xffffffffffffffff)) {
      sVar1 = buffer_customization<protozero::fixed_size_buffer_adaptor>::size(this->m_data);
      if (sVar1 == this->m_pos) {
        rollback_submessage(this);
      }
      else {
        commit_submessage(this);
      }
    }
    return;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"m_data");
  __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
}

Assistant:

void close_submessage() {
        protozero_assert(m_data);
        if (m_pos == 0 || m_rollback_pos == size_is_known) {
            return;
        }
        if (buffer_customization<TBuffer>::size(m_data) - m_pos == 0) {
            rollback_submessage();
        } else {
            commit_submessage();
        }
    }